

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_buildSeqStore(ZSTD_CCtx *zc,void *src,size_t srcSize)

{
  ZSTD_matchState_t *ms;
  seqStore_t *seqStore;
  BYTE **ppBVar1;
  U32 UVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  ZSTD_matchState_t *pZVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  size_t sVar17;
  ZSTD_blockCompressor p_Var18;
  U32 *rep;
  uint uVar19;
  long lVar20;
  ZSTD_dictMode_e dictMode;
  uint uVar21;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uStack_68;
  rawSeqStore_t local_50;
  
  if (0x20000 < srcSize) {
    __assert_fail("srcSize <= ZSTD_BLOCKSIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3307,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
  }
  uVar5 = (zc->appliedParams).cParams.windowLog;
  uVar6 = (zc->appliedParams).cParams.hashLog;
  uVar7 = (zc->appliedParams).cParams.searchLog;
  cParams1.chainLog = uVar7;
  cParams1.windowLog = uVar6;
  uVar8 = (zc->appliedParams).cParams.minMatch;
  uVar9 = (zc->appliedParams).cParams.targetLength;
  uVar10 = (zc->appliedParams).cParams.strategy;
  cParams1.minMatch = uVar10;
  cParams1.searchLog = uVar9;
  uVar11 = (zc->blockState).matchState.cParams.windowLog;
  uVar12 = (zc->blockState).matchState.cParams.hashLog;
  uVar13 = (zc->blockState).matchState.cParams.searchLog;
  cParams2.chainLog = uVar13;
  cParams2.windowLog = uVar12;
  uVar14 = (zc->blockState).matchState.cParams.minMatch;
  uVar15 = (zc->blockState).matchState.cParams.targetLength;
  uVar16 = (zc->blockState).matchState.cParams.strategy;
  cParams2.minMatch = uVar16;
  cParams2.searchLog = uVar15;
  cParams1.hashLog = uVar8;
  cParams1.targetLength = in_stack_ffffffffffffff64;
  cParams1.strategy = uVar11;
  cParams2.hashLog = uVar14;
  cParams2.targetLength = in_stack_ffffffffffffff84;
  cParams2.strategy = uVar5;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  if (srcSize < 7) {
    ZSTD_ldm_skipSequences(&zc->externSeqStore,srcSize,(zc->appliedParams).cParams.minMatch);
    sVar17 = 1;
  }
  else {
    (zc->seqStore).lit = (zc->seqStore).litStart;
    (zc->seqStore).sequences = (zc->seqStore).sequencesStart;
    (zc->seqStore).longLengthID = 0;
    pZVar3 = (zc->blockState).prevCBlock;
    (zc->blockState).matchState.opt.symbolCosts = &pZVar3->entropy;
    (zc->blockState).matchState.opt.literalCompressionMode =
         (zc->appliedParams).literalCompressionMode;
    pZVar4 = (zc->blockState).matchState.dictMatchState;
    if ((pZVar4 != (ZSTD_matchState_t *)0x0) &&
       ((zc->blockState).matchState.loadedDictEnd != (zc->blockState).matchState.window.dictLimit))
    {
      __assert_fail("ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3316,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    lVar20 = (long)src - (long)(zc->blockState).matchState.window.base;
    if (0xfffffffe < lVar20) {
      __assert_fail("istart - base < (ptrdiff_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x331c,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
    }
    UVar2 = (zc->blockState).matchState.nextToUpdate;
    uVar19 = (uint)lVar20;
    if (UVar2 + 0x180 < uVar19) {
      uVar21 = (uVar19 - UVar2) - 0x180;
      if (0xbf < uVar21) {
        uVar21 = 0xc0;
      }
      (zc->blockState).matchState.nextToUpdate = uVar19 - uVar21;
    }
    ms = &(zc->blockState).matchState;
    seqStore = &zc->seqStore;
    dictMode = ZSTD_extDict;
    if ((zc->blockState).matchState.window.dictLimit <= (zc->blockState).matchState.window.lowLimit)
    {
      dictMode = (uint)(pZVar4 != (ZSTD_matchState_t *)0x0) * 2;
    }
    rep = ((zc->blockState).nextCBlock)->rep;
    for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
      rep[lVar20] = pZVar3->rep[lVar20];
    }
    UVar2 = (zc->appliedParams).ldmParams.enableLdm;
    if ((zc->externSeqStore).pos < (zc->externSeqStore).size) {
      if (UVar2 != 0) {
        __assert_fail("!zc->appliedParams.ldmParams.enableLdm",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3329,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
      }
      sVar17 = ZSTD_ldm_blockCompress(&zc->externSeqStore,ms,seqStore,rep,src,srcSize);
      if ((zc->externSeqStore).size < (zc->externSeqStore).pos) {
        __assert_fail("zc->externSeqStore.pos <= zc->externSeqStore.size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3330,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
      }
    }
    else if (UVar2 == 0) {
      p_Var18 = ZSTD_selectBlockCompressor((zc->appliedParams).cParams.strategy,dictMode);
      sVar17 = (*p_Var18)(ms,seqStore,((zc->blockState).nextCBlock)->rep,src,srcSize);
    }
    else {
      local_50.pos = 0;
      local_50.size = 0;
      local_50.seq = zc->ldmSequences;
      local_50.capacity = zc->maxNbLdmSequences;
      sVar17 = ZSTD_ldm_generateSequences
                         (&zc->ldmState,&local_50,&(zc->appliedParams).ldmParams,src,srcSize);
      if (0xffffffffffffff88 < sVar17) {
        return sVar17;
      }
      sVar17 = ZSTD_ldm_blockCompress
                         (&local_50,ms,seqStore,((zc->blockState).nextCBlock)->rep,src,srcSize);
      if (local_50.pos != local_50.size) {
        __assert_fail("ldmSeqStore.pos == ldmSeqStore.size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x3340,"size_t ZSTD_buildSeqStore(ZSTD_CCtx *, const void *, size_t)");
      }
    }
    memcpy((zc->seqStore).lit,(void *)((long)src + (srcSize - sVar17)),sVar17);
    ppBVar1 = &(zc->seqStore).lit;
    *ppBVar1 = *ppBVar1 + sVar17;
    sVar17 = 0;
  }
  return sVar17;
}

Assistant:

static size_t ZSTD_buildSeqStore(ZSTD_CCtx* zc, const void* src, size_t srcSize)
{
    ZSTD_matchState_t* const ms = &zc->blockState.matchState;
    DEBUGLOG(5, "ZSTD_buildSeqStore (srcSize=%zu)", srcSize);
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    /* Assert that we have correctly flushed the ctx params into the ms's copy */
    ZSTD_assertEqualCParams(zc->appliedParams.cParams, ms->cParams);
    if (srcSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1) {
        ZSTD_ldm_skipSequences(&zc->externSeqStore, srcSize, zc->appliedParams.cParams.minMatch);
        return ZSTDbss_noCompress; /* don't even attempt compression below a certain srcSize */
    }
    ZSTD_resetSeqStore(&(zc->seqStore));
    /* required for optimal parser to read stats from dictionary */
    ms->opt.symbolCosts = &zc->blockState.prevCBlock->entropy;
    /* tell the optimal parser how we expect to compress literals */
    ms->opt.literalCompressionMode = zc->appliedParams.literalCompressionMode;
    /* a gap between an attached dict and the current window is not safe,
     * they must remain adjacent,
     * and when that stops being the case, the dict must be unset */
    assert(ms->dictMatchState == NULL || ms->loadedDictEnd == ms->window.dictLimit);

    /* limited update after a very long match */
    {   const BYTE* const base = ms->window.base;
        const BYTE* const istart = (const BYTE*)src;
        const U32 current = (U32)(istart-base);
        if (sizeof(ptrdiff_t)==8) assert(istart - base < (ptrdiff_t)(U32)(-1));   /* ensure no overflow */
        if (current > ms->nextToUpdate + 384)
            ms->nextToUpdate = current - MIN(192, (U32)(current - ms->nextToUpdate - 384));
    }

    /* select and store sequences */
    {   ZSTD_dictMode_e const dictMode = ZSTD_matchState_dictMode(ms);
        size_t lastLLSize;
        {   int i;
            for (i = 0; i < ZSTD_REP_NUM; ++i)
                zc->blockState.nextCBlock->rep[i] = zc->blockState.prevCBlock->rep[i];
        }
        if (zc->externSeqStore.pos < zc->externSeqStore.size) {
            assert(!zc->appliedParams.ldmParams.enableLdm);
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&zc->externSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(zc->externSeqStore.pos <= zc->externSeqStore.size);
        } else if (zc->appliedParams.ldmParams.enableLdm) {
            rawSeqStore_t ldmSeqStore = {NULL, 0, 0, 0};

            ldmSeqStore.seq = zc->ldmSequences;
            ldmSeqStore.capacity = zc->maxNbLdmSequences;
            /* Updates ldmSeqStore.size */
            FORWARD_IF_ERROR(ZSTD_ldm_generateSequences(&zc->ldmState, &ldmSeqStore,
                                               &zc->appliedParams.ldmParams,
                                               src, srcSize));
            /* Updates ldmSeqStore.pos */
            lastLLSize =
                ZSTD_ldm_blockCompress(&ldmSeqStore,
                                       ms, &zc->seqStore,
                                       zc->blockState.nextCBlock->rep,
                                       src, srcSize);
            assert(ldmSeqStore.pos == ldmSeqStore.size);
        } else {   /* not long range mode */
            ZSTD_blockCompressor const blockCompressor = ZSTD_selectBlockCompressor(zc->appliedParams.cParams.strategy, dictMode);
            lastLLSize = blockCompressor(ms, &zc->seqStore, zc->blockState.nextCBlock->rep, src, srcSize);
        }
        {   const BYTE* const lastLiterals = (const BYTE*)src + srcSize - lastLLSize;
            ZSTD_storeLastLiterals(&zc->seqStore, lastLiterals, lastLLSize);
    }   }
    return ZSTDbss_compress;
}